

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::RunContext::handleExpr
          (RunContext *this,AssertionInfo *info,ITransientExpression *expr,
          AssertionReaction *reaction)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = SUB41((info->resultDisposition & FalseTest) >> 2,0);
  if (bVar3 == expr->m_result) {
    reportExpr(this,info,ExpressionFailed,expr,bVar3);
    iVar2 = (*this->m_config->_vptr_IConfig[5])();
    reaction->shouldDebugBreak = SUB41(iVar2,0);
    uVar1 = (this->m_totals).assertions.failed;
    iVar2 = (*this->m_config->_vptr_IConfig[9])();
    bVar3 = true;
    if (uVar1 < (ulong)(long)iVar2) {
      bVar3 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
    }
    reaction->shouldThrow = bVar3;
  }
  else if (this->m_includeSuccessfulResults == false) {
    assertionPassed(this);
  }
  else {
    reportExpr(this,info,Ok,expr,bVar3);
  }
  (this->m_lastAssertionInfo).macroName.m_start = "";
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_lastAssertionInfo).capturedExpression.m_start =
       "{Unknown expression after the reported line}";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0x2c;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  return;
}

Assistant:

void RunContext::handleExpr(
        AssertionInfo const& info,
        ITransientExpression const& expr,
        AssertionReaction& reaction
    ) {
        bool negated = isFalseTest( info.resultDisposition );
        bool result = expr.getResult() != negated;

        if( result ) {
            if (!m_includeSuccessfulResults) {
                assertionPassed();
            }
            else {
                reportExpr(info, ResultWas::Ok, &expr, negated);
            }
        }
        else {
            reportExpr(info, ResultWas::ExpressionFailed, &expr, negated );
            populateReaction( reaction );
        }
        resetAssertionInfo();
    }